

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O0

string * __thiscall
cmCPackArchiveGenerator::GetArchiveComponentFileName
          (string *__return_storage_ptr__,cmCPackArchiveGenerator *this,string *component,
          bool isGroupName)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  undefined4 extraout_var;
  allocator<char> local_1a9;
  string local_1a8;
  cmValue local_188;
  string local_180 [39];
  allocator<char> local_159;
  string local_158;
  cmValue local_138;
  string local_130 [39];
  allocator<char> local_109;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  cmValue local_a8 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_49;
  undefined1 local_48 [8];
  string componentUpper;
  bool isGroupName_local;
  string *component_local;
  cmCPackArchiveGenerator *this_local;
  string *packageFileName;
  
  componentUpper.field_2._M_local_buf[0xf] = isGroupName;
  cmsys::SystemTools::UpperCase((string *)local_48,component);
  local_49 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::operator+(&local_90,"CPACK_ARCHIVE_",(string *)local_48);
  std::operator+(&local_70,&local_90,"_FILE_NAME");
  bVar1 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  if (bVar1) {
    std::operator+(&local_e8,"CPACK_ARCHIVE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::operator+(&local_c8,&local_e8,"_FILE_NAME");
    local_a8[0] = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_c8);
    psVar3 = cmValue::operator*[abi_cxx11_(local_a8);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"CPACK_ARCHIVE_FILE_NAME",&local_109);
    bVar1 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"CPACK_ARCHIVE_FILE_NAME",&local_159);
      local_138 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_158);
      psVar3 = cmValue::operator*[abi_cxx11_(&local_138);
      (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[8])
                (local_130,this,psVar3,component,
                 (ulong)((byte)componentUpper.field_2._M_local_buf[0xf] & 1));
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_130);
      std::__cxx11::string::~string(local_130);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"CPACK_PACKAGE_FILE_NAME",&local_1a9);
      local_188 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1a8);
      psVar3 = cmValue::operator*[abi_cxx11_(&local_188);
      (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[8])
                (local_180,this,psVar3,component,
                 (ulong)((byte)componentUpper.field_2._M_local_buf[0xf] & 1));
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_180);
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
    }
  }
  iVar2 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])();
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,(char *)CONCAT44(extraout_var,iVar2));
  local_49 = 1;
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackArchiveGenerator::GetArchiveComponentFileName(
  const std::string& component, bool isGroupName)
{
  std::string componentUpper(cmSystemTools::UpperCase(component));
  std::string packageFileName;

  if (this->IsSet("CPACK_ARCHIVE_" + componentUpper + "_FILE_NAME")) {
    packageFileName +=
      *this->GetOption("CPACK_ARCHIVE_" + componentUpper + "_FILE_NAME");
  } else if (this->IsSet("CPACK_ARCHIVE_FILE_NAME")) {
    packageFileName += this->GetComponentPackageFileName(
      *this->GetOption("CPACK_ARCHIVE_FILE_NAME"), component, isGroupName);
  } else {
    packageFileName += this->GetComponentPackageFileName(
      *this->GetOption("CPACK_PACKAGE_FILE_NAME"), component, isGroupName);
  }

  packageFileName += this->GetOutputExtension();

  return packageFileName;
}